

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall fasttext::Dictionary::save(Dictionary *this,ostream *out)

{
  long lVar1;
  long lVar2;
  __node_base *p_Var3;
  entry e;
  
  std::ostream::write((char *)out,(long)&this->size_);
  std::ostream::write((char *)out,(long)&this->nwords_);
  std::ostream::write((char *)out,(long)&this->nlabels_);
  std::ostream::write((char *)out,(long)&this->ntokens_);
  std::ostream::write((char *)out,(long)&this->pruneidx_size_);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < this->size_; lVar2 = lVar2 + 1) {
    entry::entry(&e,(entry *)((long)&(((this->words_).
                                       super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->word)._M_dataplus
                                     ._M_p + lVar1));
    std::ostream::write((char *)out,(long)e.word._M_dataplus._M_p);
    std::ostream::put((char)out);
    std::ostream::write((char *)out,(long)&e.count);
    std::ostream::write((char *)out,(long)&e.type);
    entry::~entry(&e);
    lVar1 = lVar1 + 0x48;
  }
  p_Var3 = &(this->pruneidx_)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    e.word._M_dataplus._M_p = *(pointer *)(p_Var3 + 1);
    std::ostream::write((char *)out,(long)&e);
    std::ostream::write((char *)out,(long)((long)&e.word._M_dataplus._M_p + 4));
  }
  return;
}

Assistant:

void Dictionary::save(std::ostream& out) const {
  out.write((char*)&size_, sizeof(int32_t));
  out.write((char*)&nwords_, sizeof(int32_t));
  out.write((char*)&nlabels_, sizeof(int32_t));
  out.write((char*)&ntokens_, sizeof(int64_t));
  out.write((char*)&pruneidx_size_, sizeof(int64_t));
  for (int32_t i = 0; i < size_; i++) {
    entry e = words_[i];
    out.write(e.word.data(), e.word.size() * sizeof(char));
    out.put(0);
    out.write((char*)&(e.count), sizeof(int64_t));
    out.write((char*)&(e.type), sizeof(entry_type));
  }
  for (const auto pair : pruneidx_) {
    out.write((char*)&(pair.first), sizeof(int32_t));
    out.write((char*)&(pair.second), sizeof(int32_t));
  }
}